

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float x2;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  float y2;
  bool local_31;
  int local_30;
  int color_n;
  bool local_19;
  ImGuiContext *pIStack_18;
  bool is_drag_docking;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  pIStack_18 = GImGui;
  g = (ImGuiContext *)window;
  if (GImGui->ActiveId != window->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x427c,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow != window) {
    __assert_fail("g.MovingWindow == window",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x427d,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->CurrentWindow != window) {
    __assert_fail("g.CurrentWindow == window",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x427e,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  (GImGui->LastItemData).ID = window->MoveId;
  g = (ImGuiContext *)window->RootWindowDockTree;
  if (((g->IO).BackendFlags & 0x200000U) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x4282,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  local_31 = true;
  if (((pIVar1->IO).ConfigDockingWithShift & 1U) == 0) {
    x2 = ((ImVec2 *)&(g->IO).FontGlobalScale)->x;
    y2 = GetFrameHeight();
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffd4,0.0,0.0,x2,y2);
    local_31 = ImRect::Contains((ImRect *)&stack0xffffffffffffffd4,&pIStack_18->ActiveIdClickOffset)
    ;
  }
  local_19 = local_31;
  if ((local_31 != false) && (bVar2 = BeginDragDropSource(0x25), bVar2)) {
    SetDragDropPayload("_IMWINDOW",&g,8,0);
    EndDragDropSource();
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      IVar3 = ColorConvertFloat4ToU32((pIStack_18->Style).Colors + GWindowDockStyleColors[local_30])
      ;
      (g->IO).KeyMap[(long)local_30 + 0xbf] = IVar3;
    }
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);
    IM_ASSERT(g.CurrentWindow == window);

    g.LastItemData.ID = window->MoveId;
    window = window->RootWindowDockTree;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset); // FIXME-DOCKING: Need to make this stateful and explicit
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();

        // Store style overrides
        for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
            window->DockStyle.Colors[color_n] = ColorConvertFloat4ToU32(g.Style.Colors[GWindowDockStyleColors[color_n]]);
    }
}